

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O2

Message * __thiscall
google::protobuf::Reflection::GetMessage
          (Reflection *this,Message *message,FieldDescriptor *field,MessageFactory *factory)

{
  int number;
  bool bVar1;
  uint32_t uVar2;
  OneofDescriptor *pOVar3;
  Message **ppMVar4;
  Descriptor *pDVar5;
  MessageLite *pMVar6;
  Message *pMVar7;
  char *description;
  Metadata MVar8;
  
  MVar8 = Message::GetMetadata(message);
  if (MVar8.reflection != this) {
    pDVar5 = this->descriptor_;
    MVar8 = Message::GetMetadata(message);
    anon_unknown_6::ReportReflectionUsageMessageError(pDVar5,MVar8.descriptor,field,"GetMessage");
  }
  pDVar5 = this->descriptor_;
  if (field->containing_type_ != pDVar5) {
    description = "Field does not match message type.";
LAB_00252864:
    anon_unknown_6::ReportReflectionUsageError(pDVar5,field,"GetMessage",description);
  }
  bVar1 = FieldDescriptor::is_repeated(field);
  if (bVar1) {
    pDVar5 = this->descriptor_;
    description = "Field is repeated; the method requires a singular field.";
    goto LAB_00252864;
  }
  if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field->type_ * 4) != 10) {
    anon_unknown_6::ReportReflectionUsageTypeError
              (this->descriptor_,field,"GetMessage",CPPTYPE_MESSAGE);
  }
  if ((field->field_0x1 & 8) != 0) {
    if (factory == (MessageFactory *)0x0) {
      factory = this->message_factory_;
    }
    uVar2 = internal::ReflectionSchema::GetExtensionSetOffset(&this->schema_);
    number = field->number_;
    pDVar5 = FieldDescriptor::message_type(field);
    pMVar6 = internal::ExtensionSet::GetMessage
                       ((ExtensionSet *)
                        ((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar2),
                        number,pDVar5,factory);
    return (Message *)pMVar6;
  }
  pOVar3 = FieldDescriptor::real_containing_oneof(field);
  if (pOVar3 != (OneofDescriptor *)0x0) {
    bVar1 = HasOneofField(this,message,field);
    if (!bVar1) goto LAB_00252810;
  }
  ppMVar4 = GetRaw<google::protobuf::Message_const*>(this,message,field);
  if (*ppMVar4 != (Message *)0x0) {
    return *ppMVar4;
  }
LAB_00252810:
  pMVar7 = GetDefaultMessageInstance(this,field);
  return pMVar7;
}

Assistant:

const Message& Reflection::GetMessage(const Message& message,
                                      const FieldDescriptor* field,
                                      MessageFactory* factory) const {
  USAGE_CHECK_ALL(GetMessage, SINGULAR, MESSAGE);

  if (factory == nullptr) factory = message_factory_;

  if (field->is_extension()) {
    return static_cast<const Message&>(GetExtensionSet(message).GetMessage(
        field->number(), field->message_type(), factory));
  } else {
    if (schema_.InRealOneof(field) && !HasOneofField(message, field)) {
      return *GetDefaultMessageInstance(field);
    }
    const Message* result = GetRaw<const Message*>(message, field);
    if (result == nullptr) {
      result = GetDefaultMessageInstance(field);
    }
    return *result;
  }
}